

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall capnp::LocalClient::~LocalClient(LocalClient *this)

{
  Server *pSVar1;
  
  pSVar1 = (this->server).ptr.ptr;
  if (pSVar1 != (Server *)0x0) {
    (pSVar1->thisHook).ptr = (ClientHook *)0x0;
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&(this->brokenException).ptr);
  kj::_::NullableValue<kj::Canceler>::~NullableValue(&(this->revoker).ptr);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&(this->resolved).ptr);
  kj::_::NullableValue<kj::ForkedPromise<void>_>::~NullableValue(&(this->resolveTask).ptr);
  kj::Own<capnp::Capability::Server,_std::nullptr_t>::dispose(&(this->server).ptr);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~LocalClient() noexcept(false) {
    KJ_IF_SOME(s, server) {
      s->thisHook = kj::none;
    }
  }